

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::getDescription_abi_cxx11_
          (ReporterFactory *this)

{
  string *in_RDI;
  
  XmlReporter::getDescription_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }